

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::String>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          String *params_1)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  char *__n;
  size_t result;
  size_t sVar3;
  long lVar4;
  size_t result_2;
  char *pcVar5;
  String local_58;
  char *local_38 [2];
  
  sVar3 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_58.content.ptr = (this->text).content.ptr;
  local_58.content.size_ = params->size_ - 1;
  if (params->size_ == 0) {
    local_58.content.size_ = sVar3;
  }
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_58.content.ptr + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x10);
  __return_storage_ptr__->size_ = sVar3;
  local_38[0] = local_58.content.ptr;
  local_38[1] = (char *)0x0;
  sVar3 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_38 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x10);
  heapString(&local_58,sVar3);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_58.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_58.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_58.content.disposer;
  local_38[0] = (char *)0x0;
  local_38[1] = (char *)0x1;
  sVar3 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_38 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x10);
  local_58.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_58.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_58.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_58.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_58.content.size_;
  (__return_storage_ptr__->branches).disposer = local_58.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (this->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pcVar5,(void *)this->size_,(size_t)__n);
    pcVar5 = pcVar5 + (long)__n;
  }
  fill<>(__return_storage_ptr__,pcVar5,0,(String *)params);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}